

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.cpp
# Opt level: O0

bool __thiscall Mustache::QtVariantContext::isFalse(QtVariantContext *this,QString *key)

{
  byte bVar1;
  int iVar2;
  double dVar3;
  QString local_90;
  QMap<QString,_QVariant> local_78;
  QHash<QString,_QVariant> local_70;
  QList<QVariant> local_68;
  undefined4 local_50;
  undefined1 local_40 [8];
  QVariant value;
  QString *key_local;
  QtVariantContext *this_local;
  
  value.d._24_8_ = key;
  QtVariantContext::value((QVariant *)local_40,this,key);
  iVar2 = ::QVariant::userType((QVariant *)local_40);
  switch(iVar2) {
  case 1:
  case 2:
  case 3:
  case 4:
  case 5:
  case 7:
    bVar1 = ::QVariant::toBool();
    this_local._7_1_ = (bool)((bVar1 ^ 0xff) & 1);
    break;
  case 6:
  case 0x26:
    dVar3 = (double)::QVariant::toDouble((bool *)local_40);
    this_local._7_1_ = dVar3 == 0.0;
    break;
  case 8:
    ::QVariant::toMap();
    this_local._7_1_ = QMap<QString,_QVariant>::isEmpty(&local_78);
    QMap<QString,_QVariant>::~QMap(&local_78);
    break;
  case 9:
  case 0xb:
    ::QVariant::toList();
    this_local._7_1_ = QList<QVariant>::isEmpty(&local_68);
    QList<QVariant>::~QList(&local_68);
    break;
  default:
    ::QVariant::toString();
    this_local._7_1_ = QString::isEmpty(&local_90);
    QString::~QString(&local_90);
    break;
  case 0x1c:
    ::QVariant::toHash();
    this_local._7_1_ = QHash<QString,_QVariant>::isEmpty(&local_70);
    QHash<QString,_QVariant>::~QHash(&local_70);
  }
  local_50 = 1;
  ::QVariant::~QVariant((QVariant *)local_40);
  return this_local._7_1_;
}

Assistant:

bool QtVariantContext::isFalse(const QString& key) const
{
	QVariant value = this->value(key);
	switch (value.userType()) {
	case QMetaType::Double:
	case QMetaType::Float:
		// QVariant::toBool() rounds floats to the nearest int and then compares
		// against 0, which is not the falsiness behavior we want.
		return value.toDouble() == 0.;
	case QMetaType::QChar:
	case QMetaType::Int:
	case QMetaType::UInt:
	case QMetaType::LongLong:
	case QMetaType::ULongLong:
	case QMetaType::Bool:
		return !value.toBool();
	case QMetaType::QVariantList:
	case QMetaType::QStringList:
		return value.toList().isEmpty();
	case QMetaType::QVariantHash:
		return value.toHash().isEmpty();
	case QMetaType::QVariantMap:
		return value.toMap().isEmpty();
	default:
		return value.toString().isEmpty();
	}
}